

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs-libc.c
# Opt level: O0

int js_module_set_import_meta(JSContext *ctx,JSValue func_val,int use_realpath,int is_main)

{
  JSValue val;
  JSValue this_obj;
  JSValue this_obj_00;
  int iVar1;
  char *__s;
  char *pcVar2;
  size_t sVar3;
  int in_ECX;
  JSContext *in_RDI;
  int in_R8D;
  JSValue JVar4;
  JSValue JVar5;
  char *res;
  char *module_name;
  JSAtom module_name_atom;
  JSValue meta_obj;
  char buf [4112];
  JSModuleDef *m;
  undefined4 in_stack_ffffffffffffef18;
  JSAtom in_stack_ffffffffffffef1c;
  JSContext *in_stack_ffffffffffffef20;
  undefined4 in_stack_ffffffffffffef28;
  undefined4 uVar6;
  int in_stack_ffffffffffffef2c;
  undefined4 uVar7;
  JSContext *in_stack_ffffffffffffef30;
  char *in_stack_ffffffffffffef38;
  undefined4 in_stack_ffffffffffffef40;
  JSAtom in_stack_ffffffffffffef44;
  JSValueUnion in_stack_ffffffffffffef48;
  JSContext *in_stack_ffffffffffffef50;
  JSValueUnion JVar8;
  char local_1058 [72];
  int local_20;
  undefined4 uStack_c;
  
  JS_GetModuleName(in_stack_ffffffffffffef20,
                   (JSModuleDef *)CONCAT44(in_stack_ffffffffffffef1c,in_stack_ffffffffffffef18));
  __s = JS_AtomToCString((JSContext *)in_stack_ffffffffffffef48.ptr,in_stack_ffffffffffffef44);
  JS_FreeAtom(in_stack_ffffffffffffef20,in_stack_ffffffffffffef1c);
  if (__s == (char *)0x0) {
    local_20 = -1;
  }
  else {
    pcVar2 = strchr(__s,0x3a);
    if (pcVar2 == (char *)0x0) {
      strcpy(local_1058,"file://");
      if (in_ECX == 0) {
        pstrcat((char *)in_stack_ffffffffffffef30,in_stack_ffffffffffffef2c,
                (char *)in_stack_ffffffffffffef20);
        __s = in_stack_ffffffffffffef38;
      }
      else {
        in_stack_ffffffffffffef30 = (JSContext *)local_1058;
        sVar3 = strlen(local_1058);
        pcVar2 = realpath(__s,(char *)((long)&(in_stack_ffffffffffffef30->header).ref_count + sVar3)
                         );
        if (pcVar2 == (char *)0x0) {
          JS_ThrowTypeError(in_RDI,"realpath failure");
          JS_FreeCString(in_stack_ffffffffffffef30,
                         (char *)CONCAT44(in_stack_ffffffffffffef2c,in_stack_ffffffffffffef28));
          return -1;
        }
      }
    }
    else {
      pstrcpy(local_1058,0x1010,__s);
      __s = in_stack_ffffffffffffef38;
    }
    JS_FreeCString(in_stack_ffffffffffffef30,
                   (char *)CONCAT44(in_stack_ffffffffffffef2c,in_stack_ffffffffffffef28));
    JVar4 = JS_GetImportMeta(in_stack_ffffffffffffef50,(JSModuleDef *)in_stack_ffffffffffffef48.ptr)
    ;
    iVar1 = JS_IsException(JVar4);
    if (iVar1 == 0) {
      uVar6 = SUB84(in_RDI,0);
      uVar7 = (undefined4)((ulong)in_RDI >> 0x20);
      JVar5 = JS_NewString(in_stack_ffffffffffffef30,(char *)in_RDI);
      JVar8 = JVar5.u;
      this_obj.tag = (int64_t)JVar8.ptr;
      this_obj.u.ptr = in_stack_ffffffffffffef48.ptr;
      JVar5.tag._0_4_ = in_stack_ffffffffffffef40;
      JVar5.u.ptr = __s;
      JVar5.tag._4_4_ = in_stack_ffffffffffffef44;
      JS_DefinePropertyValueStr
                (in_stack_ffffffffffffef30,this_obj,(char *)CONCAT44(uVar7,uVar6),JVar5,
                 JVar4.u._0_4_);
      this_obj_00.tag = (int64_t)JVar8.ptr;
      this_obj_00.u.float64 = 4.94065645841247e-324;
      val.tag._0_1_ = in_R8D != 0;
      val.u.ptr = __s;
      val.tag._1_3_ = 0;
      val.tag._4_4_ = uStack_c;
      JS_DefinePropertyValueStr
                (in_stack_ffffffffffffef30,this_obj_00,(char *)CONCAT44(uVar7,uVar6),val,
                 JVar4.u._0_4_);
      JVar4.u._4_4_ = uVar7;
      JVar4.u.int32 = uVar6;
      JVar4.tag = (int64_t)in_stack_ffffffffffffef30;
      JS_FreeValue(in_stack_ffffffffffffef20,JVar4);
      local_20 = 0;
    }
    else {
      local_20 = -1;
    }
  }
  return local_20;
}

Assistant:

int js_module_set_import_meta(JSContext *ctx, JSValueConst func_val,
                              JS_BOOL use_realpath, JS_BOOL is_main)
{
    JSModuleDef *m;
    char buf[PATH_MAX + 16];
    JSValue meta_obj;
    JSAtom module_name_atom;
    const char *module_name;
    
    assert(JS_VALUE_GET_TAG(func_val) == JS_TAG_MODULE);
    m = JS_VALUE_GET_PTR(func_val);

    module_name_atom = JS_GetModuleName(ctx, m);
    module_name = JS_AtomToCString(ctx, module_name_atom);
    JS_FreeAtom(ctx, module_name_atom);
    if (!module_name)
        return -1;
    if (!strchr(module_name, ':')) {
        strcpy(buf, "file://");
#if !defined(_WIN32)
        /* realpath() cannot be used with modules compiled with qjsc
           because the corresponding module source code is not
           necessarily present */
        if (use_realpath) {
            char *res = realpath(module_name, buf + strlen(buf));
            if (!res) {
                JS_ThrowTypeError(ctx, "realpath failure");
                JS_FreeCString(ctx, module_name);
                return -1;
            }
        } else
#endif
        {
            pstrcat(buf, sizeof(buf), module_name);
        }
    } else {
        pstrcpy(buf, sizeof(buf), module_name);
    }
    JS_FreeCString(ctx, module_name);
    
    meta_obj = JS_GetImportMeta(ctx, m);
    if (JS_IsException(meta_obj))
        return -1;
    JS_DefinePropertyValueStr(ctx, meta_obj, "url",
                              JS_NewString(ctx, buf),
                              JS_PROP_C_W_E);
    JS_DefinePropertyValueStr(ctx, meta_obj, "main",
                              JS_NewBool(ctx, is_main),
                              JS_PROP_C_W_E);
    JS_FreeValue(ctx, meta_obj);
    return 0;
}